

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O3

void search_module_in_paths(char *plugin,GModule **module,char **search_dir)

{
  undefined8 uVar1;
  GModule *pGVar2;
  
  if (*module != (GModule *)0x0) {
    return;
  }
  do {
    if (*search_dir == (char *)0x0) {
      return;
    }
    uVar1 = g_module_build_path(*search_dir,plugin);
    pGVar2 = (GModule *)g_module_open(uVar1,3);
    *module = pGVar2;
    g_free(uVar1);
    search_dir = search_dir + 1;
  } while (*module == (GModule *)0x0);
  return;
}

Assistant:

static void
search_module_in_paths(char const *plugin, GModule **module,
    char const *const *search_dir)
{
	int search_dir_index = 0;
	while (!*module && search_dir[search_dir_index]) {
		char *path = g_module_build_path(search_dir[search_dir_index],
		    plugin);
		*module = g_module_open(path,
		    G_MODULE_BIND_LAZY | G_MODULE_BIND_LOCAL);
		g_free(path);
		++search_dir_index;
	}
}